

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void __thiscall ftxui::Screen::Screen(Screen *this,int dimx,int dimy)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_83;
  undefined1 local_82;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  iterator local_58;
  size_type local_50;
  allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_> local_45 [20];
  allocator<ftxui::Pixel> local_31;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> local_30;
  int local_18;
  int local_14;
  int dimy_local;
  int dimx_local;
  Screen *this_local;
  
  (this->stencil).x_min = 0;
  (this->stencil).x_max = dimx + -1;
  (this->stencil).y_min = 0;
  (this->stencil).y_max = dimy + -1;
  this->dimx_ = dimx;
  this->dimy_ = dimy;
  local_18 = dimy;
  local_14 = dimx;
  _dimy_local = this;
  std::allocator<ftxui::Pixel>::allocator(&local_31);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector(&local_30,(long)dimx,&local_31);
  std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::allocator(local_45);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::vector(&this->pixels_,(long)dimy,&local_30,local_45);
  std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::~allocator(local_45);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector(&local_30);
  std::allocator<ftxui::Pixel>::~allocator(&local_31);
  Cursor::Cursor(&this->cursor_);
  local_82 = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_81);
  local_82 = 0;
  local_58 = &local_78;
  local_50 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_83);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->hyperlinks_,__l,&local_83);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_83);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
  do {
    local_e0 = local_e0 + -1;
    std::__cxx11::string::~string((string *)local_e0);
  } while (local_e0 != &local_78);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

Screen::Screen(int dimx, int dimy)
    : stencil{0, dimx - 1, 0, dimy - 1},
      dimx_(dimx),
      dimy_(dimy),
      pixels_(dimy, std::vector<Pixel>(dimx)) {
#if defined(_WIN32)
  // The placement of this call is a bit weird, however we can assume that
  // anybody who instantiates a Screen object eventually wants to output
  // something to the console.
  // As we require UTF8 for all input/output operations we will just switch to
  // UTF8 encoding here
  SetConsoleOutputCP(CP_UTF8);
  SetConsoleCP(CP_UTF8);
  WindowsEmulateVT100Terminal();
#endif
}